

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

int AF_A_CheckReload(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  AWeapon *this;
  PClass *pPVar3;
  PClass *pPVar4;
  char *__assertion;
  undefined8 *puVar5;
  bool bVar6;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0055992d;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar5 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar5 == (undefined8 *)0x0) {
LAB_00559838:
        puVar5 = (undefined8 *)0x0;
      }
      else {
        pPVar4 = (PClass *)puVar5[1];
        if (pPVar4 == (PClass *)0x0) {
          pPVar4 = (PClass *)(**(code **)*puVar5)(puVar5);
          puVar5[1] = pPVar4;
        }
        bVar6 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar3 && bVar6) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar6 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar3) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar6) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0055992d;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005598e6;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0055991d;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar4 = (PClass *)puVar2[1];
            if (pPVar4 == (PClass *)0x0) {
              pPVar4 = (PClass *)(**(code **)*puVar2)(puVar2);
              puVar2[1] = pPVar4;
            }
            bVar6 = pPVar4 != (PClass *)0x0;
            if (pPVar4 != pPVar3 && bVar6) {
              do {
                pPVar4 = pPVar4->ParentClass;
                bVar6 = pPVar4 != (PClass *)0x0;
                if (pPVar4 == pPVar3) break;
              } while (pPVar4 != (PClass *)0x0);
            }
            if (!bVar6) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0055992d;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_0055991d;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005598e6:
        if (puVar5[0x40] != 0) {
          this = *(AWeapon **)(puVar5[0x40] + 0xd0);
          AWeapon::CheckAmmo(this,(uint)this->bAltFire,true,false,-1);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0055992d;
    }
    if (puVar5 == (undefined8 *)0x0) goto LAB_00559838;
  }
LAB_0055991d:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0055992d:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x3a7,"int AF_A_CheckReload(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AInventory, A_CheckReload)
{
	PARAM_ACTION_PROLOGUE;

	if (self->player != NULL)
	{
		self->player->ReadyWeapon->CheckAmmo (
			self->player->ReadyWeapon->bAltFire ? AWeapon::AltFire
			: AWeapon::PrimaryFire, true);
	}
	return 0;
}